

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetColumnOffset(int column_index,float offset)

{
  int iVar1;
  ImGuiColumns *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiColumnData *pIVar6;
  int iVar7;
  ImGuiColumnData *pIVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  
  pIVar4 = GImGui;
  pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar2 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1cac,"void ImGui::SetColumnOffset(int, float)");
  }
  iVar1 = (pIVar2->Columns).Size;
  do {
    if (column_index < 0) {
      column_index = pIVar2->Current;
    }
    if (iVar1 <= column_index) {
      __assert_fail("column_index < columns->Columns.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0x1cb0,"void ImGui::SetColumnOffset(int, float)");
    }
    fVar10 = 0.0;
    if (((pIVar2->Flags & 4U) == 0) && (column_index < pIVar2->Count + -1)) {
      iVar5 = column_index;
      if (column_index < 0) {
        iVar5 = pIVar2->Current;
      }
      iVar7 = iVar5 + 1;
      if (pIVar2->IsBeingResized == false) {
        if (iVar1 <= iVar7) goto LAB_00210ca7;
        pIVar6 = (pIVar2->Columns).Data;
        pIVar8 = pIVar6 + iVar7;
        pIVar6 = pIVar6 + iVar5;
      }
      else {
        if (iVar1 <= iVar7) {
LAB_00210ca7:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                        ,0x503,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]"
                       );
        }
        pIVar6 = (pIVar2->Columns).Data;
        pIVar8 = (ImGuiColumnData *)&pIVar6[iVar7].OffsetNormBeforeResize;
        pIVar6 = (ImGuiColumnData *)&pIVar6[iVar5].OffsetNormBeforeResize;
      }
      fVar10 = (pIVar2->OffMaxX - pIVar2->OffMinX) * (pIVar8->OffsetNorm - pIVar6->OffsetNorm);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    if (((pIVar2->Flags & 8U) == 0) &&
       (fVar11 = pIVar2->OffMaxX -
                 (float)(pIVar2->Count - column_index) * (pIVar4->Style).ColumnsMinSpacing,
       fVar11 <= offset)) {
      offset = fVar11;
    }
    (pIVar2->Columns).Data[column_index].OffsetNorm =
         (offset - pIVar2->OffMinX) / (pIVar2->OffMaxX - pIVar2->OffMinX);
    if (!bVar3) {
      return;
    }
    column_index = column_index + 1;
    fVar11 = (pIVar4->Style).ColumnsMinSpacing;
    uVar9 = -(uint)(fVar10 <= fVar11);
    offset = offset + (float)(~uVar9 & (uint)fVar10 | (uint)fVar11 & uVar9);
  } while( true );
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < columns->Count-1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}